

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O1

CURLcode Curl_hmacit(HMAC_params *hashparams,uchar *key,size_t keylen,uchar *buf,size_t buflen,
                    uchar *output)

{
  uint uVar1;
  CURLcode CVar2;
  HMAC_context *ctxt;
  
  uVar1 = curlx_uztoui(keylen);
  ctxt = Curl_HMAC_init(hashparams,key,uVar1);
  if (ctxt == (HMAC_context *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    uVar1 = curlx_uztoui(buflen);
    (*ctxt->hash->hupdate)(ctxt->hashctxt1,buf,uVar1);
    Curl_HMAC_final(ctxt,output);
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_hmacit(const struct HMAC_params *hashparams,
                     const unsigned char *key, const size_t keylen,
                     const unsigned char *buf, const size_t buflen,
                     unsigned char *output)
{
  struct HMAC_context *ctxt =
    Curl_HMAC_init(hashparams, key, curlx_uztoui(keylen));

  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  Curl_HMAC_update(ctxt, buf, curlx_uztoui(buflen));

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, output);

  return CURLE_OK;
}